

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O0

void highbd_warp_plane(WarpedMotionParams *wm,uint16_t *ref,int width,int height,int stride,
                      uint16_t *pred,int p_col,int p_row,int p_width,int p_height,int p_stride,
                      int subsampling_x,int subsampling_y,int bd,ConvolveParams *conv_params)

{
  int in_ECX;
  int in_EDX;
  uint16_t *in_RSI;
  int32_t *in_RDI;
  int in_R8D;
  uint16_t *in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  ConvolveParams *in_stack_00000048;
  int16_t delta;
  int16_t gamma;
  int16_t beta;
  int16_t alpha;
  int32_t *mat;
  
  (*av1_highbd_warp_affine)
            (in_RDI,in_RSI,in_EDX,in_ECX,in_R8D,in_R9,in_stack_00000008,in_stack_00000010,
             in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
             in_stack_00000038,in_stack_00000040,in_stack_00000048,(int16_t)in_RDI[6],
             *(int16_t *)((long)in_RDI + 0x1a),(int16_t)in_RDI[7],*(int16_t *)((long)in_RDI + 0x1e))
  ;
  return;
}

Assistant:

void highbd_warp_plane(WarpedMotionParams *wm, const uint16_t *const ref,
                       int width, int height, int stride, uint16_t *const pred,
                       int p_col, int p_row, int p_width, int p_height,
                       int p_stride, int subsampling_x, int subsampling_y,
                       int bd, ConvolveParams *conv_params) {
  const int32_t *const mat = wm->wmmat;
  const int16_t alpha = wm->alpha;
  const int16_t beta = wm->beta;
  const int16_t gamma = wm->gamma;
  const int16_t delta = wm->delta;

  av1_highbd_warp_affine(mat, ref, width, height, stride, pred, p_col, p_row,
                         p_width, p_height, p_stride, subsampling_x,
                         subsampling_y, bd, conv_params, alpha, beta, gamma,
                         delta);
}